

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O3

IndexTableSegment * __thiscall
ASDCP::MXF::IndexTableSegment::InitFromTLVSet(IndexTableSegment *this,TLVReader *TLVSet)

{
  size_t *psVar1;
  byte_t *pbVar2;
  iterator __position;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  MDDEntry *pMVar6;
  ILogSink *this_00;
  uint uVar7;
  ulong uVar8;
  TLVReader *in_RDX;
  uint uVar9;
  undefined1 *puVar10;
  uint uVar11;
  IndexEntry tmp_item;
  Result_t result;
  TLVReader local_110;
  vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
  *local_a8;
  ulong local_a0;
  int local_98;
  
  InterchangeObject::InitFromTLVSet((InterchangeObject *)&stack0xffffffffffffff68,TLVSet);
  if (-1 < local_98) {
    pMVar6 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_IndexEditRate);
    TLVReader::ReadObject(&local_110,(MDDEntry *)in_RDX,(IArchive *)pMVar6);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
    Kumu::Result_t::~Result_t((Result_t *)&local_110);
    if (-1 < local_98) {
      pMVar6 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_IndexTableSegmentBase_IndexStartPosition);
      TLVReader::ReadUi64(&local_110,(MDDEntry *)in_RDX,(ui64_t *)pMVar6);
      Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
      Kumu::Result_t::~Result_t((Result_t *)&local_110);
      if (-1 < local_98) {
        pMVar6 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                  MDD_IndexTableSegmentBase_IndexDuration);
        TLVReader::ReadUi64(&local_110,(MDDEntry *)in_RDX,(ui64_t *)pMVar6);
        Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
        Kumu::Result_t::~Result_t((Result_t *)&local_110);
        if (-1 < local_98) {
          pMVar6 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                    MDD_IndexTableSegmentBase_EditUnitByteCount);
          TLVReader::ReadUi32(&local_110,(MDDEntry *)in_RDX,(ui32_t *)pMVar6);
          Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
          Kumu::Result_t::~Result_t((Result_t *)&local_110);
          if (-1 < local_98) {
            pMVar6 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                      MDD_Core_IndexSID);
            TLVReader::ReadUi32(&local_110,(MDDEntry *)in_RDX,(ui32_t *)pMVar6);
            Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
            Kumu::Result_t::~Result_t((Result_t *)&local_110);
            if (-1 < local_98) {
              pMVar6 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                        MDD_Core_BodySID);
              TLVReader::ReadUi32(&local_110,(MDDEntry *)in_RDX,(ui32_t *)pMVar6);
              Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110)
              ;
              Kumu::Result_t::~Result_t((Result_t *)&local_110);
              if (-1 < local_98) {
                pMVar6 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                          MDD_IndexTableSegmentBase_SliceCount);
                TLVReader::ReadUi8(&local_110,(MDDEntry *)in_RDX,pMVar6->ul);
                Kumu::Result_t::operator=
                          ((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
                Kumu::Result_t::~Result_t((Result_t *)&local_110);
                if (-1 < local_98) {
                  pMVar6 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                            MDD_IndexTableSegmentBase_PosTableCount);
                  TLVReader::ReadUi8(&local_110,(MDDEntry *)in_RDX,pMVar6->ul);
                  Kumu::Result_t::operator=
                            ((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
                  Kumu::Result_t::~Result_t((Result_t *)&local_110);
                  if (-1 < local_98) {
                    pMVar6 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                              MDD_IndexTableSegment_DeltaEntryArray);
                    TLVReader::ReadObject(&local_110,(MDDEntry *)in_RDX,(IArchive *)pMVar6);
                    Kumu::Result_t::operator=
                              ((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
                    Kumu::Result_t::~Result_t((Result_t *)&local_110);
                    if (-1 < local_98) {
                      pMVar6 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                                MDD_IndexTableSegment_IndexEntryArray);
                      bVar3 = TLVReader::FindTL(in_RDX,pMVar6);
                      if (bVar3) {
                        uVar8 = (ulong)(in_RDX->super_MemIOReader).m_capacity;
                        uVar11 = (in_RDX->super_MemIOReader).m_size;
                        bVar3 = true;
                        if ((ulong)uVar11 + 4 <= uVar8) {
                          pbVar2 = (in_RDX->super_MemIOReader).m_p;
                          uVar7 = *(uint *)(pbVar2 + uVar11);
                          uVar9 = uVar11 + 4;
                          (in_RDX->super_MemIOReader).m_size = uVar9;
                          if ((ulong)uVar9 + 4 <= uVar8) {
                            uVar9 = *(uint *)(pbVar2 + uVar9);
                            (in_RDX->super_MemIOReader).m_size = uVar11 + 8;
                            bVar3 = true;
                            uVar11 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8
                                     | uVar7 << 0x18;
                            if (uVar7 != 0) {
                              uVar7 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
                              local_a0 = (ulong)uVar7;
                              local_a8 = (vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
                                          *)&TLVSet[3].m_ElementMap._M_t._M_impl.
                                             super__Rb_tree_header._M_header._M_right;
                              uVar9 = 0;
                              do {
                                local_110.super_MemIOReader.m_p = (byte_t *)&PTR__IArchive_00222c18;
                                local_110.super_MemIOReader.m_capacity._0_2_ = 0;
                                local_110.super_MemIOReader.m_capacity._2_1_ = 0x80;
                                local_110.m_ElementMap._M_t._M_impl._0_8_ = 0;
                                bVar4 = IndexEntry::Unarchive
                                                  ((IndexEntry *)&local_110,
                                                   &in_RDX->super_MemIOReader);
                                if (!bVar4) {
LAB_001b0196:
                                  bVar3 = false;
                                  break;
                                }
                                __position._M_current =
                                     (IndexEntry *)
                                     TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count;
                                if (__position._M_current == (IndexEntry *)TLVSet[3].m_Lookup) {
                                  std::
                                  vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
                                  ::
                                  _M_realloc_insert<ASDCP::MXF::IndexTableSegment::IndexEntry_const&>
                                            (local_a8,__position,(IndexEntry *)&local_110);
                                }
                                else {
                                  ((__position._M_current)->super_IArchive)._vptr_IArchive =
                                       (_func_int **)&PTR__IArchive_00222c18;
                                  (__position._M_current)->TemporalOffset =
                                       (char)(undefined2)local_110.super_MemIOReader.m_capacity;
                                  (__position._M_current)->KeyFrameOffset =
                                       (char)((ushort)(undefined2)
                                                      local_110.super_MemIOReader.m_capacity >> 8);
                                  (__position._M_current)->Flags =
                                       local_110.super_MemIOReader.m_capacity._2_1_;
                                  *(undefined5 *)&(__position._M_current)->field_0xb =
                                       local_110.super_MemIOReader._11_5_;
                                  (__position._M_current)->StreamOffset =
                                       local_110.m_ElementMap._M_t._M_impl._0_8_;
                                  psVar1 = &TLVSet[3].m_ElementMap._M_t._M_impl.
                                            super__Rb_tree_header._M_node_count;
                                  *psVar1 = *psVar1 + 0x18;
                                }
                                if (0xb < (uint)local_a0) {
                                  uVar5 = (in_RDX->super_MemIOReader).m_size + (uVar7 - 0xb);
                                  if ((in_RDX->super_MemIOReader).m_capacity < uVar5)
                                  goto LAB_001b0196;
                                  (in_RDX->super_MemIOReader).m_size = uVar5;
                                }
                                uVar9 = uVar9 + 1;
                              } while (uVar9 < uVar11);
                            }
                            if (((long)(TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count -
                                       (long)TLVSet[3].m_ElementMap._M_t._M_impl.
                                             super__Rb_tree_header._M_header._M_right) >> 3) *
                                -0x5555555555555555 - (ulong)uVar11 != 0) {
                              this_00 = (ILogSink *)Kumu::DefaultLogSink();
                              Kumu::ILogSink::Error
                                        (this_00,
                                         "Malformed index table segment, could not decode all IndexEntries.\n"
                                        );
                              Kumu::Result_t::Result_t
                                        ((Result_t *)this,(Result_t *)ASDCP::RESULT_KLV_CODING);
                              goto LAB_001b0174;
                            }
                          }
                        }
                      }
                      else {
                        bVar3 = false;
                      }
                      puVar10 = Kumu::RESULT_FALSE;
                      if (bVar3) {
                        puVar10 = Kumu::RESULT_OK;
                      }
                      Kumu::Result_t::operator=
                                ((Result_t *)&stack0xffffffffffffff68,(Result_t *)puVar10);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
LAB_001b0174:
  Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::IndexTableSegment::InitFromTLVSet(TLVReader& TLVSet)
{
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(IndexTableSegmentBase, IndexEditRate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi64(OBJ_READ_ARGS(IndexTableSegmentBase, IndexStartPosition));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi64(OBJ_READ_ARGS(IndexTableSegmentBase, IndexDuration));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(IndexTableSegmentBase, EditUnitByteCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(IndexTableSegmentBase, IndexSID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(EssenceContainerData, BodySID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(IndexTableSegmentBase, SliceCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(IndexTableSegmentBase, PosTableCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(IndexTableSegment, DeltaEntryArray));

  if ( ASDCP_SUCCESS(result) )
    {
      bool rc = TLVSet.FindTL(m_Dict->Type(MDD_IndexTableSegment_IndexEntryArray));

      if ( rc )
	{
	  ui32_t item_count, item_size;
	  ui32_t const decoder_item_size = IndexEntryArray.ItemSize();

	  if ( TLVSet.ReadUi32BE(&item_count) )
	    {
	      if ( TLVSet.ReadUi32BE(&item_size) )
		{
		  for ( ui32_t i = 0; i < item_count && rc; ++i )
		    {
		      IndexEntry tmp_item;
		      rc = tmp_item.Unarchive(&TLVSet);

		      if ( rc )
			{
			  IndexEntryArray.push_back(tmp_item);

			  if ( decoder_item_size < item_size )
			    {
			      rc = TLVSet.SkipOffset(item_size - decoder_item_size);
			    }
			}
		    }
          if (IndexEntryArray.size() != item_count)
          {
              DefaultLogSink().Error("Malformed index table segment, could not decode all IndexEntries.\n");
              return RESULT_KLV_CODING;
          }
		}
	    }
	}

      result = rc ? RESULT_OK : RESULT_FALSE;
    }

  return result;
}